

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int calc_verify_data(void *output,st_ptls_key_schedule_t *sched,void *secret)

{
  size_t outlen;
  int iVar1;
  ptls_hash_context_t *ppVar2;
  ptls_iovec_t secret_00;
  uint8_t digest [64];
  undefined1 local_68 [64];
  
  outlen = sched->algo->digest_size;
  secret_00.len = outlen;
  secret_00.base = (uint8_t *)secret;
  iVar1 = hkdf_expand_label(sched->algo,local_68,outlen,secret_00,"finished",
                            (ptls_iovec_t)ZEXT816(0));
  if (iVar1 == 0) {
    ppVar2 = ptls_hmac_create(sched->algo,local_68,sched->algo->digest_size);
    if (ppVar2 == (ptls_hash_context_t *)0x0) {
      (*ptls_clear_memory)(local_68,0x40);
      iVar1 = 0x201;
    }
    else {
      (*sched->msghash->final)(sched->msghash,local_68,PTLS_HASH_FINAL_MODE_SNAPSHOT);
      (*ppVar2->update)(ppVar2,local_68,sched->algo->digest_size);
      (*ptls_clear_memory)(local_68,0x40);
      iVar1 = 0;
      (*ppVar2->final)(ppVar2,output,PTLS_HASH_FINAL_MODE_FREE);
    }
  }
  return iVar1;
}

Assistant:

static int calc_verify_data(void *output, struct st_ptls_key_schedule_t *sched, const void *secret)
{
    ptls_hash_context_t *hmac;
    uint8_t digest[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = hkdf_expand_label(sched->algo, digest, sched->algo->digest_size, ptls_iovec_init(secret, sched->algo->digest_size),
                                 "finished", ptls_iovec_init(NULL, 0))) != 0)
        return ret;
    if ((hmac = ptls_hmac_create(sched->algo, digest, sched->algo->digest_size)) == NULL) {
        ptls_clear_memory(digest, sizeof(digest));
        return PTLS_ERROR_NO_MEMORY;
    }

    sched->msghash->final(sched->msghash, digest, PTLS_HASH_FINAL_MODE_SNAPSHOT);
    PTLS_DEBUGF("%s: %02x%02x,%02x%02x\n", __FUNCTION__, ((uint8_t *)secret)[0], ((uint8_t *)secret)[1], digest[0], digest[1]);
    hmac->update(hmac, digest, sched->algo->digest_size);
    ptls_clear_memory(digest, sizeof(digest));
    hmac->final(hmac, output, PTLS_HASH_FINAL_MODE_FREE);

    return 0;
}